

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

void ndiCloseSerial(ndicapi *device)

{
  ndiSetThreadMode(device,false);
  ndiSerialClose(device->SerialDevice);
  free(device->SerialDeviceName);
  free(device->Command);
  free(device->Reply);
  free(device->ReplyNoCRC);
  free(device);
  return;
}

Assistant:

ndicapiExport void ndiCloseSerial(ndicapi* device)
{
  // end the tracking thread if it is running
  ndiSetThreadMode(device, 0);

  // close the serial port
  ndiSerialClose(device->SerialDevice);

  // free the buffers
  free(device->SerialDeviceName);
  free(device->Command);
  free(device->Reply);
  free(device->ReplyNoCRC);
  device->SerialDeviceName = NULL;
  device->SerialDevice = NDI_INVALID_HANDLE;

  free(device);
}